

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

void png_destroy_read_struct
               (png_structpp png_ptr_ptr,png_infopp info_ptr_ptr,png_infopp end_info_ptr_ptr)

{
  byte *pbVar1;
  uint uVar2;
  png_const_structrp png_ptr;
  
  if (png_ptr_ptr == (png_structpp)0x0) {
    png_ptr = (png_const_structrp)0x0;
  }
  else {
    png_ptr = *png_ptr_ptr;
  }
  if (png_ptr != (png_const_structrp)0x0) {
    png_destroy_info_struct(png_ptr,end_info_ptr_ptr);
    png_destroy_info_struct(png_ptr,info_ptr_ptr);
    *png_ptr_ptr = (png_struct *)0x0;
    png_destroy_gamma_table(png_ptr);
    png_free(png_ptr,png_ptr->big_row_buf);
    png_ptr->big_row_buf = (png_bytep)0x0;
    png_free(png_ptr,png_ptr->big_prev_row);
    png_ptr->big_prev_row = (png_bytep)0x0;
    png_free(png_ptr,png_ptr->read_buffer);
    png_ptr->read_buffer = (png_bytep)0x0;
    png_free(png_ptr,png_ptr->palette_lookup);
    png_ptr->palette_lookup = (png_bytep)0x0;
    png_free(png_ptr,png_ptr->quantize_index);
    png_ptr->quantize_index = (png_bytep)0x0;
    if ((png_ptr->free_me & 0x1000) != 0) {
      png_zfree(png_ptr,png_ptr->palette);
      png_ptr->palette = (png_colorp)0x0;
    }
    uVar2 = png_ptr->free_me;
    png_ptr->free_me = uVar2 & 0xffffefff;
    if ((uVar2 >> 0xd & 1) != 0) {
      png_free(png_ptr,png_ptr->trans_alpha);
      png_ptr->trans_alpha = (png_bytep)0x0;
    }
    pbVar1 = (byte *)((long)&png_ptr->free_me + 1);
    *pbVar1 = *pbVar1 & 0xdf;
    inflateEnd(&png_ptr->zstream);
    png_free(png_ptr,png_ptr->save_buffer);
    png_ptr->save_buffer = (png_bytep)0x0;
    png_free(png_ptr,(png_ptr->unknown_chunk).data);
    (png_ptr->unknown_chunk).data = (png_byte *)0x0;
    png_free(png_ptr,png_ptr->chunk_list);
    png_ptr->chunk_list = (png_bytep)0x0;
    png_destroy_png_struct(png_ptr);
    return;
  }
  return;
}

Assistant:

void PNGAPI
png_destroy_read_struct(png_structpp png_ptr_ptr, png_infopp info_ptr_ptr,
    png_infopp end_info_ptr_ptr)
{
   png_structrp png_ptr = NULL;

   png_debug(1, "in png_destroy_read_struct");

   if (png_ptr_ptr != NULL)
      png_ptr = *png_ptr_ptr;

   if (png_ptr == NULL)
      return;

   /* libpng 1.6.0: use the API to destroy info structs to ensure consistent
    * behavior.  Prior to 1.6.0 libpng did extra 'info' destruction in this API.
    * The extra was, apparently, unnecessary yet this hides memory leak bugs.
    */
   png_destroy_info_struct(png_ptr, end_info_ptr_ptr);
   png_destroy_info_struct(png_ptr, info_ptr_ptr);

   *png_ptr_ptr = NULL;
   png_read_destroy(png_ptr);
   png_destroy_png_struct(png_ptr);
}